

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessbackend.cpp
# Opt level: O0

QByteArray * __thiscall
QNetworkAccessBackend::rawHeader(QNetworkAccessBackend *this,QByteArray *header)

{
  QAnyStringView headerName;
  QNetworkAccessBackendPrivate *pQVar1;
  QByteArray *str;
  QAnyStringView *in_RDX;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_fffffffffffffff0;
  size_t sVar2;
  
  sVar2 = *(size_t *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QNetworkAccessBackend *)0x188b2b);
  str = (QByteArray *)QNetworkReplyImplPrivate::q_func(pQVar1->m_reply);
  QAnyStringView::QAnyStringView(in_RDX,str);
  headerName.m_size = sVar2;
  headerName.field_0.m_data = in_stack_fffffffffffffff0.m_data;
  QNetworkReply::rawHeader((QNetworkReply *)in_RDX,headerName);
  if (*(size_t *)(in_FS_OFFSET + 0x28) == sVar2) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QNetworkAccessBackend::rawHeader(const QByteArray &header) const
{
    return d_func()->m_reply->q_func()->rawHeader(header);
}